

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderBuiltinVarTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::ShaderDepthRangeTest::ShaderDepthRangeTest
          (ShaderDepthRangeTest *this,Context *context,char *name,char *desc,bool isVertexCase)

{
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDepthRangeTest_01e198e0;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,name,desc,isVertexCase,
             &(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderDepthRangeTest_01e198e0;
  (this->m_depthRange).zNear = 0.0;
  (this->m_depthRange).zFar = 1.0;
  deqp::gls::ShaderEvaluator::ShaderEvaluator(&(this->m_evaluator).super_ShaderEvaluator);
  (this->m_evaluator).super_ShaderEvaluator._vptr_ShaderEvaluator =
       (_func_int **)&PTR__ShaderEvaluator_01e198a0;
  (this->m_evaluator).m_params = &this->m_depthRange;
  this->m_iterNdx = 0;
  return;
}

Assistant:

ShaderDepthRangeTest (Context& context, const char* name, const char* desc, bool isVertexCase)
		: ShaderRenderCase	(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), name, desc, isVertexCase, m_evaluator)
		, m_evaluator		(m_depthRange)
		, m_iterNdx			(0)
	{
	}